

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyclichash.h
# Opt level: O1

void __thiscall
CyclicHash<unsigned_int,_unsigned_char>::CyclicHash
          (CyclicHash<unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  uint uVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  int iVar4;
  
  this->hashvalue = 0;
  this->n = myn;
  this->wordsize = mywordsize;
  uVar1 = maskfnc<unsigned_int>(mywordsize);
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,uVar1);
  uVar1 = maskfnc<unsigned_int>(this->wordsize + -1);
  this->mask1 = uVar1;
  iVar4 = this->n % this->wordsize;
  this->myr = iVar4;
  uVar1 = maskfnc<unsigned_int>(this->wordsize - iVar4);
  this->maskn = uVar1;
  if ((uint)this->wordsize < 0x21) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Can\'t create ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->wordsize);
  poVar2 = std::operator<<(poVar2,"-bit hash values");
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "abord";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

CyclicHash(int myn, int mywordsize = 19)
      : hashvalue(0), n(myn), wordsize(mywordsize),
        hasher(maskfnc<hashvaluetype>(wordsize)),
        mask1(maskfnc<hashvaluetype>(wordsize - 1)), myr(n % wordsize),
        maskn(maskfnc<hashvaluetype>(wordsize - myr)) {
    if (static_cast<uint>(wordsize) > 8 * sizeof(hashvaluetype)) {
      cerr << "Can't create " << wordsize << "-bit hash values" << endl;
      throw "abord";
    }
  }